

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O2

void req0_retry_cb(void *arg)

{
  nni_list *list;
  nng_err nVar1;
  int iVar2;
  nni_time nVar3;
  void *item;
  bool bVar4;
  
  nVar3 = nni_clock();
  nni_mtx_lock((nni_mtx *)((long)arg + 0x358));
  if (*(char *)((long)arg + 4) == '\0') {
    nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x130));
    if (nVar1 == NNG_OK) {
      list = (nni_list *)((long)arg + 0x118);
      item = nni_list_first(list);
      bVar4 = false;
      for (; item != (void *)0x0; item = nni_list_next(list,item)) {
        if ((*(ulong *)((long)item + 0x80) <= nVar3) && (*(long *)((long)item + 0x60) != 0)) {
          iVar2 = nni_list_node_active((nni_list_node *)((long)item + 0x18));
          bVar4 = true;
          if (iVar2 == 0) {
            nni_list_append((nni_list *)((long)arg + 0x100),item);
          }
        }
      }
      iVar2 = nni_list_empty(list);
      if (iVar2 == 0) {
        nni_sleep_aio(*(nng_duration *)((long)arg + 0x350),(nni_aio *)((long)arg + 0x130));
      }
      else {
        *(undefined1 *)((long)arg + 5) = 0;
      }
      if (bVar4) {
        req0_run_send_queue((req0_sock *)arg,(nni_aio_completions *)0x0);
      }
    }
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x358));
  return;
}

Assistant:

static void
req0_retry_cb(void *arg)
{
	req0_sock *s = arg;
	req0_ctx  *ctx;
	nni_time   now;
	bool       reschedule = false;

	// The design of this is that retries are infrequent, because
	// we should normally be succeeding.  We also hope that we are not
	// executing this linear scan of all requests too often, once
	// per clock tick is all we want.
	now = nni_clock();
	nni_mtx_lock(&s->mtx);
	if (s->closed || (nni_aio_result(&s->retry_aio) != 0)) {
		nni_mtx_unlock(&s->mtx);
		return;
	}

	NNI_LIST_FOREACH (&s->retry_queue, ctx) {
		if (ctx->retry_time > now || (ctx->req_msg == NULL)) {
			continue;
		}
		if (!nni_list_node_active(&ctx->send_node)) {
			nni_list_append(&s->send_queue, ctx);
		}
		reschedule = true;
	}
	if (!nni_list_empty(&s->retry_queue)) {
		// if there are still jobs in the queue waiting to be
		// retried, do them.
		nni_sleep_aio(s->retry_tick, &s->retry_aio);
	} else {
		s->retry_active = false;
	}
	if (reschedule) {
		req0_run_send_queue(s, NULL);
	}
	nni_mtx_unlock(&s->mtx);
}